

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cayley.cpp
# Opt level: O2

rotation_t * opengv::math::cayley2rot(rotation_t *__return_storage_ptr__,cayley_t *cayley)

{
  double dVar1;
  undefined1 auVar2 [16];
  double dVar3;
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  double dVar7;
  undefined1 auVar8 [16];
  double dVar9;
  undefined1 auVar10 [16];
  CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_3,_0,_3,_3>_>,_const_Eigen::Matrix<double,_3,_3,_0,_3,_3>_>
  local_30;
  
  dVar1 = (cayley->super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).m_storage.m_data.
          array[0];
  auVar6._8_8_ = dVar1;
  auVar6._0_8_ = dVar1;
  auVar2 = *(undefined1 (*) [16])
            ((cayley->super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).m_storage.m_data
             .array + 1);
  auVar8._8_8_ = 0;
  auVar8._0_8_ = (cayley->super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).m_storage.
                 m_data.array[2];
  dVar7 = auVar2._0_8_;
  dVar3 = dVar7 * dVar7;
  auVar10._0_8_ = dVar7 * dVar7;
  auVar10._8_8_ = auVar2._8_8_ * auVar2._8_8_;
  auVar4 = vshufpd_avx(auVar2,auVar2,1);
  auVar5 = vfmsub213pd_fma(auVar4,auVar6,auVar2);
  dVar7 = dVar1 * dVar1 + 1.0;
  auVar4 = vshufpd_avx(auVar10,auVar10,1);
  dVar1 = 1.0 - dVar1 * dVar1;
  dVar9 = auVar4._0_8_;
  (__return_storage_ptr__->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.
  m_data.array[0] = (dVar7 - dVar3) - dVar9;
  auVar4 = vfmadd213sd_fma(auVar8,auVar6,auVar2);
  (__return_storage_ptr__->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.
  m_data.array[6] = auVar4._0_8_ + auVar4._0_8_;
  auVar4 = vfmadd213sd_fma(auVar2,auVar6,auVar8);
  (__return_storage_ptr__->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.
  m_data.array[1] = auVar4._0_8_ + auVar4._0_8_;
  (__return_storage_ptr__->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.
  m_data.array[4] = (dVar1 + dVar3) - dVar9;
  auVar4 = vfmsub213sd_fma(auVar8,auVar2,auVar6);
  auVar2 = vfmadd213sd_fma(auVar8,auVar2,auVar6);
  (__return_storage_ptr__->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.
  m_data.array[7] = auVar4._0_8_ + auVar4._0_8_;
  (__return_storage_ptr__->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.
  m_data.array[2] = auVar5._0_8_ + auVar5._0_8_;
  (__return_storage_ptr__->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.
  m_data.array[3] = auVar5._8_8_ + auVar5._8_8_;
  (__return_storage_ptr__->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.
  m_data.array[5] = auVar2._0_8_ + auVar2._0_8_;
  local_30.m_lhs.m_functor.m_other = 1.0 / (dVar9 + dVar7 + dVar3);
  (__return_storage_ptr__->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.
  m_data.array[8] = dVar9 + (dVar1 - dVar3);
  local_30.m_rhs = __return_storage_ptr__;
  Eigen::internal::
  call_assignment<Eigen::Matrix<double,3,3,0,3,3>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,3,3,0,3,3>const>const,Eigen::Matrix<double,3,3,0,3,3>const>>
            (__return_storage_ptr__,&local_30);
  return __return_storage_ptr__;
}

Assistant:

opengv::rotation_t
opengv::math::cayley2rot( const cayley_t & cayley)
{
  rotation_t R;
  double scale = 1+pow(cayley[0],2)+pow(cayley[1],2)+pow(cayley[2],2);

  R(0,0) = 1+pow(cayley[0],2)-pow(cayley[1],2)-pow(cayley[2],2);
  R(0,1) = 2*(cayley[0]*cayley[1]-cayley[2]);
  R(0,2) = 2*(cayley[0]*cayley[2]+cayley[1]);
  R(1,0) = 2*(cayley[0]*cayley[1]+cayley[2]);
  R(1,1) = 1-pow(cayley[0],2)+pow(cayley[1],2)-pow(cayley[2],2);
  R(1,2) = 2*(cayley[1]*cayley[2]-cayley[0]);
  R(2,0) = 2*(cayley[0]*cayley[2]-cayley[1]);
  R(2,1) = 2*(cayley[1]*cayley[2]+cayley[0]);
  R(2,2) = 1-pow(cayley[0],2)-pow(cayley[1],2)+pow(cayley[2],2);

  R = (1/scale) * R;
  return R;
}